

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaK_exp2nextreg(FuncState *fs,expdesc *e)

{
  luaK_dischargevars(fs,e);
  freeexp(fs,e);
  luaK_reserveregs(fs,1);
  exp2reg(fs,e,fs->freereg + -1);
  return;
}

Assistant:

static void luaK_exp2nextreg(FuncState*fs,expdesc*e){
luaK_dischargevars(fs,e);
freeexp(fs,e);
luaK_reserveregs(fs,1);
exp2reg(fs,e,fs->freereg-1);
}